

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::reset
          (IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this,
          int32_t depth)

{
  variant<std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  local_38;
  int32_t local_14;
  IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *pIStack_10;
  int32_t depth_local;
  IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this_local;
  
  if (-1 < this->mDepth - depth) {
    local_14 = depth;
    pIStack_10 = this;
    memset(&local_38,0,0x20);
    std::
    variant<std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
    ::variant(&local_38);
    std::
    variant<std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
    ::operator=(&this->mVariant,&local_38);
    std::
    variant<std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
    ::~variant(&local_38);
    this->mDepth = local_14;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }